

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O2

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  uint uVar1;
  VIterator ppVar2;
  reference __v;
  pair<llvm::NoneType,_bool> pVar3;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar4;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppVar2 = vfind(this,V);
    uVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
            super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
            super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.Size;
    if (ppVar2 == (VIterator)
                  ((ulong)uVar1 * 8 +
                  (long)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                        super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                        super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                        super_SmallVectorBase.BeginX)) {
      pVar3.first = None;
      pVar3.second = true;
      pVar3._5_3_ = 0;
      if (uVar1 < 0x20) {
        SmallVectorTemplateBase<std::pair<int,_int>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this,V);
      }
      else {
        uVar1 = 1;
        while (uVar1 != 0) {
          __v = SmallVectorTemplateCommon<std::pair<int,_int>,_void>::back
                          ((SmallVectorTemplateCommon<std::pair<int,_int>,_void> *)this);
          std::
          _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
          ::_M_insert_unique<std::pair<int,int>const&>
                    ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                      *)&this->Set,__v);
          SmallVectorTemplateBase<std::pair<int,_int>,_true>::pop_back
                    ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this);
          uVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                  super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                  super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
                  Size;
        }
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)&this->Set,V);
      }
    }
    else {
      pVar3.first = None;
      pVar3.second = false;
      pVar3._5_3_ = 0;
    }
  }
  else {
    pVar4 = std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>const&>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&this->Set,V);
    pVar3 = (pair<llvm::NoneType,_bool>)(((ulong)pVar4.second << 0x20) + 1);
  }
  return pVar3;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }